

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_linear.c
# Opt level: O1

void mpt_values_linear(long points,double *target,long ld,double min,double max)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  
  if (0 < points && target != (double *)0x0) {
    *target = min;
    if (2 < points) {
      pdVar2 = target + ld;
      lVar3 = 1;
      do {
        *pdVar2 = (double)lVar3 * ((max - min) / (double)(points + -1)) + min;
        lVar1 = lVar3 - points;
        lVar3 = lVar3 + 1;
        pdVar2 = pdVar2 + ld;
      } while (lVar1 != -2);
    }
    target[(points + -1) * ld] = max;
  }
  return;
}

Assistant:

extern void mpt_values_linear(long points, double *target, long ld, double min, double max)
{
	long i, len;
	double dv;
	
	if (!target || points < 1) {
		return;
	}
	dv = (max - min) / (len = points - 1);
	
	target[0] = min;
	
	for (i = 1; i < len; i++) {
		target[i * ld] = min + i * dv;
	}
	target[len * ld] = max;
}